

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha.c
# Opt level: O3

int chacha_test(uint8_t *input_buffer)

{
  uint8_t *in;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  chacha_iv iv;
  chacha_key key;
  uint8_t h_iv [16];
  uint8_t final_hchacha [32];
  uint8_t h_key [32];
  uint8_t out [2056];
  chacha_iv local_8b0;
  chacha_key local_8a8;
  uint8_t local_888 [81];
  uint8_t local_837 [2055];
  
  builtin_memcpy(local_8a8.b," !\"#$%&\'()*+,-./0123456789:;<=>?",0x20);
  local_8b0.b[0] = 0x80;
  local_8b0.b[1] = 0x81;
  local_8b0.b[2] = 0x82;
  local_8b0.b[3] = 0x83;
  local_8b0.b[4] = 0x84;
  local_8b0.b[5] = 0x85;
  local_8b0.b[6] = 0x86;
  local_8b0.b[7] = 0x87;
  uVar1 = chacha_test_oneblock(&local_8a8,&local_8b0,input_buffer,local_888 + 0x50);
  uVar2 = chacha_test_oneblock(&local_8a8,&local_8b0,input_buffer,local_837);
  if (input_buffer == (uint8_t *)0x0) {
    uVar3 = chacha_test_multiblock(&local_8a8,&local_8b0,(uint8_t *)0x0,local_888 + 0x50);
    uVar4 = chacha_test_multiblock(&local_8a8,&local_8b0,(uint8_t *)0x0,local_837);
    uVar5 = chacha_test_multiblock_incremental
                      (&local_8a8,&local_8b0,(uint8_t *)0x0,local_888 + 0x50);
    uVar6 = chacha_test_multiblock_incremental(&local_8a8,&local_8b0,(uint8_t *)0x0,local_837);
    uVar3 = uVar6 & uVar5 & uVar4 & uVar3;
  }
  else {
    in = input_buffer + 1;
    uVar3 = chacha_test_oneblock(&local_8a8,&local_8b0,in,local_888 + 0x50);
    uVar4 = chacha_test_oneblock(&local_8a8,&local_8b0,in,local_837);
    uVar5 = chacha_test_multiblock(&local_8a8,&local_8b0,input_buffer,local_888 + 0x50);
    uVar6 = chacha_test_multiblock(&local_8a8,&local_8b0,input_buffer,local_837);
    uVar7 = chacha_test_multiblock(&local_8a8,&local_8b0,in,local_888 + 0x50);
    uVar8 = chacha_test_multiblock(&local_8a8,&local_8b0,in,local_837);
    uVar9 = chacha_test_multiblock_incremental(&local_8a8,&local_8b0,input_buffer,local_888 + 0x50);
    uVar10 = chacha_test_multiblock_incremental(&local_8a8,&local_8b0,input_buffer,local_837);
    uVar11 = chacha_test_multiblock_incremental(&local_8a8,&local_8b0,in,local_888 + 0x50);
    uVar12 = chacha_test_multiblock_incremental(&local_8a8,&local_8b0,in,local_837);
    uVar3 = uVar11 & uVar10 & uVar12 & uVar8 & uVar7 & uVar9 & uVar6 & uVar5 & uVar4 & uVar3;
  }
  local_888[0x30] = 0xc0;
  local_888[0x31] = 0xc1;
  local_888[0x32] = 0xc2;
  local_888[0x33] = 0xc3;
  local_888[0x34] = 0xc4;
  local_888[0x35] = 0xc5;
  local_888[0x36] = 0xc6;
  local_888[0x37] = 199;
  local_888[0x38] = 200;
  local_888[0x39] = 0xc9;
  local_888[0x3a] = 0xca;
  local_888[0x3b] = 0xcb;
  local_888[0x3c] = 0xcc;
  local_888[0x3d] = 0xcd;
  local_888[0x3e] = 0xce;
  local_888[0x3f] = 0xcf;
  local_888[0x40] = 0xd0;
  local_888[0x41] = 0xd1;
  local_888[0x42] = 0xd2;
  local_888[0x43] = 0xd3;
  local_888[0x44] = 0xd4;
  local_888[0x45] = 0xd5;
  local_888[0x46] = 0xd6;
  local_888[0x47] = 0xd7;
  local_888[0x48] = 0xd8;
  local_888[0x49] = 0xd9;
  local_888[0x4a] = 0xda;
  local_888[0x4b] = 0xdb;
  local_888[0x4c] = 0xdc;
  local_888[0x4d] = 0xdd;
  local_888[0x4e] = 0xde;
  local_888[0x4f] = 0xdf;
  builtin_memcpy(local_888,"\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1a\x1b\x1c\x1d\x1e\x1f",0x11);
  local_888[0x11] = '\0';
  local_888[0x12] = '\0';
  local_888[0x13] = '\0';
  local_888[0x14] = '\0';
  local_888[0x15] = '\0';
  local_888[0x16] = '\0';
  local_888[0x17] = '\0';
  local_888[0x18] = '\0';
  local_888[0x19] = '\0';
  local_888[0x1a] = '\0';
  local_888[0x1b] = '\0';
  local_888[0x1c] = '\0';
  local_888[0x1d] = '\0';
  local_888[0x1e] = '\0';
  local_888[0x1f] = '\0';
  local_888[0x20] = '\0';
  local_888[0x21] = '\0';
  local_888[0x22] = '\0';
  local_888[0x23] = '\0';
  local_888[0x24] = '\0';
  local_888[0x25] = '\0';
  local_888[0x26] = '\0';
  local_888[0x27] = '\0';
  local_888[0x28] = '\0';
  local_888[0x29] = '\0';
  local_888[0x2a] = '\0';
  local_888[0x2b] = '\0';
  local_888[0x2c] = '\0';
  local_888[0x2d] = '\0';
  local_888[0x2e] = '\0';
  local_888[0x2f] = '\0';
  hchacha_ref(local_888 + 0x30,local_888,local_888 + 0x10,8);
  auVar14[0] = -(local_888[0x20] == '{');
  auVar14[1] = -(local_888[0x21] == -0x57);
  auVar14[2] = -(local_888[0x22] == '6');
  auVar14[3] = -(local_888[0x23] == -0xd);
  auVar14[4] = -(local_888[0x24] == 'c');
  auVar14[5] = -(local_888[0x25] == '/');
  auVar14[6] = -(local_888[0x26] == '\\');
  auVar14[7] = -(local_888[0x27] == 'm');
  auVar14[8] = -(local_888[0x28] == '@');
  auVar14[9] = -(local_888[0x29] == '9');
  auVar14[10] = -(local_888[0x2a] == '$');
  auVar14[0xb] = -(local_888[0x2b] == -0x4d);
  auVar14[0xc] = -(local_888[0x2c] == 't');
  auVar14[0xd] = -(local_888[0x2d] == 'h');
  auVar14[0xe] = -(local_888[0x2e] == -0x35);
  auVar14[0xf] = -(local_888[0x2f] == -0x23);
  auVar13[0] = -(local_888[0x10] == -0x1a);
  auVar13[1] = -(local_888[0x11] == '\x19');
  auVar13[2] = -(local_888[0x12] == '\x0f');
  auVar13[3] = -(local_888[0x13] == 'H');
  auVar13[4] = -(local_888[0x14] == -0xf);
  auVar13[5] = -(local_888[0x15] == -0x40);
  auVar13[6] = -(local_888[0x16] == '*');
  auVar13[7] = -(local_888[0x17] == 'h');
  auVar13[8] = -(local_888[0x18] == -0x48);
  auVar13[9] = -(local_888[0x19] == -0xe);
  auVar13[10] = -(local_888[0x1a] == '.');
  auVar13[0xb] = -(local_888[0x1b] == -8);
  auVar13[0xc] = -(local_888[0x1c] == -0x44);
  auVar13[0xd] = -(local_888[0x1d] == -3);
  auVar13[0xe] = -(local_888[0x1e] == 'A');
  auVar13[0xf] = -(local_888[0x1f] == '\x06');
  auVar13 = auVar13 & auVar14;
  uVar4 = 0;
  if ((ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) | (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar13[0xf] >> 7) << 0xf) == 0xffff) {
    uVar4 = uVar2 & uVar1 & uVar3;
  }
  return uVar4;
}

Assistant:

static int
chacha_test(const uint8_t *input_buffer) {
    chacha_key key;
    chacha_iv iv;
    uint8_t h_key[32];
    uint8_t h_iv[16];
    uint8_t out[CHACHA_TEST_LEN+sizeof(size_t)], final_hchacha[32];
    const uint8_t *in_aligned, *in_unaligned;
    uint8_t *out_aligned, *out_unaligned;
    size_t i;
    int res = 1;

    /*
        key [32,33,34,..63], iv [128,129,130,131,132,133,134,135]
    */
    for (i = 0; i < sizeof(key); i++) key.b[i] = (uint8_t)(i + 32);
    for (i = 0; i < sizeof(iv); i++) iv.b[i] = (uint8_t)(i + 128);

    in_aligned = input_buffer;
    in_unaligned = (input_buffer) ? (input_buffer + 1) : NULL;
    out_aligned = out;
    out_unaligned = out + 1;

    /* single block */
    res &= chacha_test_oneblock(&key, &iv,   in_aligned,   out_aligned);
    res &= chacha_test_oneblock(&key, &iv,   in_aligned, out_unaligned);
    if (input_buffer) {
        res &= chacha_test_oneblock(&key, &iv, in_unaligned,   out_aligned);
        res &= chacha_test_oneblock(&key, &iv, in_unaligned, out_unaligned);
    }

    /* multi */
    res &= chacha_test_multiblock(&key, &iv,   in_aligned,   out_aligned);
    res &= chacha_test_multiblock(&key, &iv,   in_aligned, out_unaligned);
    if (input_buffer) {
        res &= chacha_test_multiblock(&key, &iv, in_unaligned,   out_aligned);
        res &= chacha_test_multiblock(&key, &iv, in_unaligned, out_unaligned);
    }

    /* incremental */
    res &= chacha_test_multiblock_incremental(&key, &iv,   in_aligned,   out_aligned);
    res &= chacha_test_multiblock_incremental(&key, &iv,   in_aligned, out_unaligned);
    if (input_buffer) {
        res &= chacha_test_multiblock_incremental(&key, &iv, in_unaligned,   out_aligned);
        res &= chacha_test_multiblock_incremental(&key, &iv, in_unaligned, out_unaligned);
    }

    /*
        hchacha
        key [192,193,194,..223], iv [16,17,18,..31]
    */
    for (i = 0; i < sizeof(h_key); i++) h_key[i] = (uint8_t)(i + 192);
    for (i = 0; i < sizeof(h_iv); i++) h_iv[i] = (uint8_t)(i + 16);

    memset(final_hchacha, 0, sizeof(final_hchacha));
    hchacha(h_key, h_iv, final_hchacha, chacha_test_rounds);
    res &= (memcmp(expected_hchacha, final_hchacha, sizeof(expected_hchacha)) == 0) ? 1 : 0;

    return res;
}